

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void * jx9StreamOpenHandle(jx9_vm *pVm,jx9_io_stream *pStream,char *zFile,int iFlags,int use_include
                          ,jx9_value *pResource,int bPushInclude,int *pNew)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  sxi32 sVar5;
  sxu32 sVar6;
  char *pcVar7;
  long unaff_R13;
  SyString sFile;
  int local_84;
  void *local_80;
  SyBlob local_78;
  int local_54;
  char *local_50;
  uint local_48;
  jx9_value *local_40;
  jx9_io_stream *local_38;
  
  local_80 = (void *)0x0;
  if (pStream != (jx9_io_stream *)0x0) {
    cVar1 = *zFile;
    pcVar7 = zFile;
    if (cVar1 != '\0') {
      pcVar4 = zFile + 2;
      do {
        pcVar7 = pcVar4;
        if (pcVar7[-1] == '\0') {
          pcVar7 = pcVar7 + -1;
          goto LAB_0012e118;
        }
        if (*pcVar7 == '\0') goto LAB_0012e118;
        if (pcVar7[1] == '\0') {
          pcVar7 = pcVar7 + 1;
          goto LAB_0012e118;
        }
        pcVar4 = pcVar7 + 4;
      } while (pcVar7[2] != '\0');
      pcVar7 = pcVar7 + 2;
    }
LAB_0012e118:
    local_48 = (int)pcVar7 - (int)zFile;
    local_50 = zFile;
    if (use_include == 0) {
      local_84 = (*pStream->xOpen)(zFile,iFlags,pResource,&local_80);
    }
    else {
      if (((cVar1 == '/') || (((cVar1 == '.' && (1 < local_48)) && (zFile[1] == '/')))) ||
         ((((cVar1 == '.' && (2 < local_48)) && (zFile[1] == '.')) && (zFile[2] == '/')))) {
        local_84 = (*pStream->xOpen)(zFile,iFlags,pResource,&local_80);
      }
      else {
        local_78.pBlob = (char *)0x0;
        local_78.nByte = 0;
        local_78.mByte = 0;
        local_78.nFlags = 0;
        (pVm->aPaths).nCursor = 0;
        local_84 = -2;
        local_78.pAllocator = &pVm->sAllocator;
        local_54 = iFlags;
        local_40 = pResource;
        local_38 = pStream;
        while( true ) {
          do {
            uVar2 = (pVm->aPaths).nUsed;
            uVar3 = (pVm->aPaths).nCursor;
            sVar6 = 0;
            if (uVar3 < uVar2) {
              unaff_R13 = (ulong)((pVm->aPaths).eSize * uVar3) + (long)(pVm->aPaths).pBase;
              sVar6 = uVar3 + 1;
            }
            (pVm->aPaths).nCursor = sVar6;
            if (uVar2 <= uVar3) goto LAB_0012e2ab;
            SyBlobFormat(&local_78,"%z%c%z",unaff_R13,0x2f,&local_50);
            sVar6 = local_78.nByte;
            sVar5 = SyBlobAppend(&local_78,"",1);
          } while (sVar5 != 0);
          local_78.nByte = sVar6;
          local_84 = (*local_38->xOpen)((char *)local_78.pBlob,local_54,local_40,&local_80);
          if (local_84 == 0) break;
          local_78.nByte = 0;
          if ((local_78.nFlags & 4) != 0) {
            local_78.pBlob = (char *)0x0;
            local_78.nByte = 0;
            local_78.mByte = 0;
            local_78.nFlags = local_78.nFlags & 0xfffffffb;
          }
        }
        if (bPushInclude == 0) {
          local_84 = 0;
        }
        else {
          local_84 = 0;
          jx9VmPushFilePath(pVm,(char *)local_78.pBlob,local_78.nByte,'\0',pNew);
        }
LAB_0012e2ab:
        if (((local_78.nFlags & 6) == 0) && (local_78.mByte != 0)) {
          SyMemBackendFree(local_78.pAllocator,local_78.pBlob);
        }
        local_78.pBlob = (void *)0x0;
        local_78.nByte = 0;
        local_78.mByte = 0;
        local_78.nFlags = 0;
      }
      if ((bPushInclude != 0) && (local_84 == 0)) {
        local_84 = 0;
        jx9VmPushFilePath(pVm,local_50,local_48,'\0',pNew);
      }
    }
    if (local_84 == 0) {
      return local_80;
    }
  }
  return (void *)0x0;
}

Assistant:

JX9_PRIVATE void * jx9StreamOpenHandle(jx9_vm *pVm, const jx9_io_stream *pStream, const char *zFile, 
	int iFlags, int use_include, jx9_value *pResource, int bPushInclude, int *pNew)
{
	void *pHandle = 0; /* cc warning */
	SyString sFile;
	int rc;
	if( pStream == 0 ){
		/* No such stream device */
		return 0;
	}
	SyStringInitFromBuf(&sFile, zFile, SyStrlen(zFile));
	if( use_include ){
		if(	sFile.zString[0] == '/' ||
#ifdef __WINNT__
			(sFile.nByte > 2 && sFile.zString[1] == ':' && (sFile.zString[2] == '\\' || sFile.zString[2] == '/') ) ||
#endif
			(sFile.nByte > 1 && sFile.zString[0] == '.' && sFile.zString[1] == '/') ||
			(sFile.nByte > 2 && sFile.zString[0] == '.' && sFile.zString[1] == '.' && sFile.zString[2] == '/') ){
				/*  Open the file directly */
				rc = pStream->xOpen(zFile, iFlags, pResource, &pHandle);
		}else{
			SyString *pPath;
			SyBlob sWorker;
#ifdef __WINNT__
			static const int c = '\\';
#else
			static const int c = '/';
#endif
			/* Init the path builder working buffer */
			SyBlobInit(&sWorker, &pVm->sAllocator);
			/* Build a path from the set of include path */
			SySetResetCursor(&pVm->aPaths);
			rc = SXERR_IO;
			while( SXRET_OK == SySetGetNextEntry(&pVm->aPaths, (void **)&pPath) ){
				/* Build full path */
				SyBlobFormat(&sWorker, "%z%c%z", pPath, c, &sFile);
				/* Append null terminator */
				if( SXRET_OK != SyBlobNullAppend(&sWorker) ){
					continue;
				}
				/* Try to open the file */
				rc = pStream->xOpen((const char *)SyBlobData(&sWorker), iFlags, pResource, &pHandle);
				if( rc == JX9_OK ){
					if( bPushInclude ){
						/* Mark as included */
						jx9VmPushFilePath(pVm, (const char *)SyBlobData(&sWorker), SyBlobLength(&sWorker), FALSE, pNew);
					}
					break;
				}
				/* Reset the working buffer */
				SyBlobReset(&sWorker);
				/* Check the next path */
			}
			SyBlobRelease(&sWorker);
		}
		if( rc == JX9_OK ){
			if( bPushInclude ){
				/* Mark as included */
				jx9VmPushFilePath(pVm, sFile.zString, sFile.nByte, FALSE, pNew);
			}
		}
	}else{
		/* Open the URI direcly */
		rc = pStream->xOpen(zFile, iFlags, pResource, &pHandle);
	}
	if( rc != JX9_OK ){
		/* IO error */
		return 0;
	}
	/* Return the file handle */
	return pHandle;
}